

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  ImVec4 *pIVar1;
  undefined8 *puVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  ImDrawChannel *pIVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  long lVar12;
  ImDrawChannel *__dest;
  void *pvVar13;
  void *__dest_00;
  long lVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  
  iVar4 = (this->_Channels).Size;
  if (iVar4 < channels_count) {
    iVar5 = (this->_Channels).Capacity;
    if (iVar5 < channels_count) {
      if (iVar5 == 0) {
        iVar15 = 8;
      }
      else {
        iVar15 = iVar5 / 2 + iVar5;
      }
      if (iVar15 <= channels_count) {
        iVar15 = channels_count;
      }
      if (iVar5 < iVar15) {
        __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar15 << 5);
        pIVar6 = (this->_Channels).Data;
        if (pIVar6 != (ImDrawChannel *)0x0) {
          memcpy(__dest,pIVar6,(long)(this->_Channels).Size << 5);
          ImGui::MemFree((this->_Channels).Data);
        }
        (this->_Channels).Data = __dest;
        (this->_Channels).Capacity = iVar15;
      }
    }
    (this->_Channels).Size = channels_count;
  }
  this->_Count = channels_count;
  pIVar6 = (this->_Channels).Data;
  (pIVar6->_IdxBuffer).Size = 0;
  (pIVar6->_IdxBuffer).Capacity = 0;
  (pIVar6->_IdxBuffer).Data = (uint *)0x0;
  (pIVar6->_CmdBuffer).Size = 0;
  (pIVar6->_CmdBuffer).Capacity = 0;
  (pIVar6->_CmdBuffer).Data = (ImDrawCmd *)0x0;
  if (1 < channels_count) {
    uVar17 = 1;
    lVar16 = 0x38;
    do {
      pIVar6 = (this->_Channels).Data;
      puVar2 = (undefined8 *)((long)&(pIVar6->_CmdBuffer).Size + lVar16);
      if ((long)uVar17 < (long)iVar4) {
        iVar5 = *(int *)((long)pIVar6 + lVar16 + -0x14);
        if (iVar5 < 0) {
          uVar18 = iVar5 / 2 + iVar5;
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          pvVar13 = ImGui::MemAlloc((ulong)uVar18 * 0x38);
          pvVar7 = *(void **)((long)pIVar6 + lVar16 + -0x10);
          if (pvVar7 != (void *)0x0) {
            memcpy(pvVar13,pvVar7,(long)*(int *)((long)pIVar6 + lVar16 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar6 + lVar16 + -0x10));
          }
          *(void **)((long)pIVar6 + lVar16 + -0x10) = pvVar13;
          *(uint *)((long)pIVar6 + lVar16 + -0x14) = uVar18;
        }
        *(undefined4 *)(puVar2 + -3) = 0;
        pIVar6 = (this->_Channels).Data;
        iVar5 = *(int *)((long)pIVar6 + lVar16 + -4);
        if (iVar5 < 0) {
          uVar18 = iVar5 / 2 + iVar5;
          if ((int)uVar18 < 1) {
            uVar18 = 0;
          }
          pvVar13 = ImGui::MemAlloc((ulong)uVar18 * 4);
          pvVar7 = *(void **)((long)&(pIVar6->_CmdBuffer).Size + lVar16);
          if (pvVar7 != (void *)0x0) {
            memcpy(pvVar13,pvVar7,(long)*(int *)((long)pIVar6 + lVar16 + -8) << 2);
            ImGui::MemFree(*(void **)((long)&(pIVar6->_CmdBuffer).Size + lVar16));
          }
          *(void **)((long)&(pIVar6->_CmdBuffer).Size + lVar16) = pvVar13;
          *(uint *)((long)pIVar6 + lVar16 + -4) = uVar18;
        }
        *(undefined4 *)((long)pIVar6 + lVar16 + -8) = 0;
      }
      else {
        puVar2[-1] = 0;
        *puVar2 = 0;
        puVar2[-3] = 0;
        puVar2[-2] = 0;
      }
      pIVar6 = (this->_Channels).Data;
      if (*(int *)((long)pIVar6 + lVar16 + -0x18) == 0) {
        pIVar1 = (draw_list->_ClipRectStack).Data + (long)(draw_list->_ClipRectStack).Size + -1;
        lVar9._0_4_ = pIVar1->x;
        lVar9._4_4_ = pIVar1->y;
        uVar10 = pIVar1->z;
        uVar11 = pIVar1->w;
        pvVar7 = (draw_list->_TextureIdStack).Data[(long)(draw_list->_TextureIdStack).Size + -1];
        if (*(int *)((long)pIVar6 + lVar16 + -0x14) == 0) {
          __dest_00 = ImGui::MemAlloc(0x1c0);
          pvVar13 = *(void **)((long)pIVar6 + lVar16 + -0x10);
          if (pvVar13 != (void *)0x0) {
            memcpy(__dest_00,pvVar13,(long)*(int *)((long)pIVar6 + lVar16 + -0x18) * 0x38);
            ImGui::MemFree(*(void **)((long)pIVar6 + lVar16 + -0x10));
          }
          *(void **)((long)pIVar6 + lVar16 + -0x10) = __dest_00;
          *(undefined4 *)((long)pIVar6 + lVar16 + -0x14) = 8;
        }
        lVar8 = *(long *)((long)pIVar6 + lVar16 + -0x10);
        lVar14 = (long)*(int *)((long)pIVar6 + lVar16 + -0x18) * 0x38;
        *(ulong *)(lVar8 + 0x10 + lVar14) = CONCAT44(uStack_34,uVar11);
        lVar12 = CONCAT44(uVar10,lVar9._4_4_);
        *(long *)(lVar8 + lVar14) = lVar9 << 0x20;
        ((long *)(lVar8 + lVar14))[1] = lVar12;
        *(void **)(lVar8 + 0x18 + lVar14) = pvVar7;
        puVar2 = (undefined8 *)(lVar8 + 0x20 + lVar14);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)(lVar8 + 0x30 + lVar14) = 0;
        piVar3 = (int *)((long)pIVar6 + lVar16 + -0x18);
        *piVar3 = *piVar3 + 1;
      }
      uVar17 = uVar17 + 1;
      lVar16 = lVar16 + 0x20;
    } while ((uint)channels_count != uVar17);
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_ASSERT(_Current == 0 && _Count <= 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
        if (_Channels[i]._CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = draw_list->_ClipRectStack.back();
            draw_cmd.TextureId = draw_list->_TextureIdStack.back();
            _Channels[i]._CmdBuffer.push_back(draw_cmd);
        }
    }
}